

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc_cord_state.cc
# Opt level: O2

PrefixCrc __thiscall
absl::lts_20250127::crc_internal::CrcCordState::NormalizedPrefixCrcAtNthChunk
          (CrcCordState *this,size_t n)

{
  RefcountedRep *pRVar1;
  crc32c_t cVar2;
  size_t sVar3;
  reference pPVar4;
  size_t length_b;
  PrefixCrc PVar5;
  
  sVar3 = NumChunks(this);
  if (n < sVar3) {
    sVar3 = (this->refcounted_rep_->rep).removed_prefix.length;
    pPVar4 = std::
             _Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
             ::operator[](&(this->refcounted_rep_->rep).prefix_crc.
                           super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                           ._M_impl.super__Deque_impl_data._M_start,n);
    length_b = pPVar4->length;
    if (sVar3 == 0) {
      cVar2.crc_ = (pPVar4->crc).crc_;
    }
    else {
      pRVar1 = this->refcounted_rep_;
      length_b = length_b - (pRVar1->rep).removed_prefix.length;
      cVar2.crc_ = (pRVar1->rep).removed_prefix.crc.crc_;
      pPVar4 = std::
               _Deque_iterator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_&,_absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc_*>
               ::operator[](&(pRVar1->rep).prefix_crc.
                             super__Deque_base<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc,_std::allocator<absl::lts_20250127::crc_internal::CrcCordState::PrefixCrc>_>
                             ._M_impl.super__Deque_impl_data._M_start,n);
      cVar2 = RemoveCrc32cPrefix(cVar2,(pPVar4->crc).crc_,length_b);
    }
    PVar5.crc.crc_ = cVar2.crc_;
    PVar5.length = length_b;
    PVar5._12_4_ = 0;
    return PVar5;
  }
  __assert_fail("n < NumChunks()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/crc/internal/crc_cord_state.cc"
                ,0x58,
                "CrcCordState::PrefixCrc absl::crc_internal::CrcCordState::NormalizedPrefixCrcAtNthChunk(size_t) const"
               );
}

Assistant:

CrcCordState::PrefixCrc CrcCordState::NormalizedPrefixCrcAtNthChunk(
    size_t n) const {
  assert(n < NumChunks());
  if (IsNormalized()) {
    return rep().prefix_crc[n];
  }
  size_t length = rep().prefix_crc[n].length - rep().removed_prefix.length;
  return PrefixCrc(length,
                   absl::RemoveCrc32cPrefix(rep().removed_prefix.crc,
                                            rep().prefix_crc[n].crc, length));
}